

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filtering.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_5e038::FilterKernel<4U>::FilterKernel(FilterKernel<4U> *this,float multiplier_)

{
  undefined1 auVar1 [16];
  undefined1 uVar2;
  long in_RDI;
  uint uVar3;
  undefined1 in_ZMM0 [64];
  undefined1 auVar4 [64];
  uint32_t j;
  uint32_t i;
  uint32_t size;
  undefined4 local_18;
  undefined4 local_14;
  undefined1 extraout_var [60];
  
  uVar3 = in_ZMM0._0_4_;
  for (local_14 = 0; local_14 < 0x400; local_14 = local_14 + 1) {
    for (local_18 = local_14; local_18 < 0x400; local_18 = local_18 + 1) {
      auVar1 = vcvtusi2ss_avx512f(in_ZMM0._0_16_,local_14 * local_14 + local_18 * local_18);
      auVar4._0_4_ = sqrtf(auVar1._0_4_);
      auVar4._4_60_ = extraout_var;
      auVar1 = vfmadd213ss_fma(ZEXT416(uVar3),auVar4._0_16_,SUB6416(ZEXT464(0x3f000000),0));
      in_ZMM0 = ZEXT1664(auVar1);
      uVar2 = (undefined1)(int)auVar1._0_4_;
      *(undefined1 *)(in_RDI + (ulong)local_18 * 0x400 + (ulong)local_14) = uVar2;
      *(undefined1 *)(in_RDI + (ulong)local_14 * 0x400 + (ulong)local_18) = uVar2;
    }
  }
  return;
}

Assistant:

explicit FilterKernel(float multiplier_)
        {
            const uint32_t size = 256u * sizeInBytes;
            for ( uint32_t i = 0; i < size; ++i ) {
                for ( uint32_t j = i; j < size; ++j )
                    kernel[i][j] = kernel[j][i] = static_cast<uint8_t>(sqrtf( static_cast<float>(i * i + j * j) ) * multiplier_ + 0.5f);
            }
        }